

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  bool bVar1;
  char *pcVar2;
  string *in_RDI;
  string *this;
  char *local_188;
  string s;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  char *local_c8;
  string format;
  undefined1 local_88 [8];
  FilePath result;
  undefined1 local_48 [8];
  FilePath output_name;
  
  std::__cxx11::string::string((string *)&local_188,(string *)FLAGS_gtest_output_abi_cxx11_);
  GetOutputFormat_abi_cxx11_();
  if (format._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,"xml",(allocator<char> *)local_88);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  pcVar2 = strchr(local_188,0x3a);
  if (pcVar2 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(s.field_2._M_local_buf + 8),
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)(format.field_2._M_local_buf + 8));
    FilePath::FilePath((FilePath *)local_88,(string *)((long)&s.field_2 + 8));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"test_detail",
               (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
    FilePath::FilePath((FilePath *)((long)&result.pathname_.field_2 + 8),&local_148);
    FilePath::MakeFileName
              ((FilePath *)local_48,(FilePath *)local_88,
               (FilePath *)((long)&result.pathname_.field_2 + 8),0,local_c8);
    std::__cxx11::string::string((string *)in_RDI,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::string::~string((string *)(result.pathname_.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)local_88);
    this = (string *)(s.field_2._M_local_buf + 8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,pcVar2 + 1,(allocator<char> *)local_88);
    FilePath::FilePath((FilePath *)local_48,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    bVar1 = FilePath::IsAbsolutePath((FilePath *)local_48);
    if (!bVar1) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,
                 (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xf));
      FilePath::FilePath((FilePath *)((long)&result.pathname_.field_2 + 8),&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,pcVar2 + 1,
                 (allocator<char> *)(output_name.pathname_.field_2._M_local_buf + 0xe));
      FilePath::FilePath((FilePath *)((long)&format.field_2 + 8),&local_e8);
      FilePath::ConcatPaths
                ((FilePath *)local_88,(FilePath *)((long)&result.pathname_.field_2 + 8),
                 (FilePath *)((long)&format.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_48,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)(result.pathname_.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_108);
    }
    bVar1 = FilePath::IsDirectory((FilePath *)local_48);
    if (bVar1) {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                ((FilePath *)local_88,(FilePath *)local_48,
                 (FilePath *)((long)&result.pathname_.field_2 + 8),(char *)format.field_2._8_8_);
      std::__cxx11::string::~string((string *)(format.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(result.pathname_.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)in_RDI,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
    }
    else {
      std::__cxx11::string::string((string *)in_RDI,(string *)local_48);
    }
    this = (string *)local_48;
  }
  std::__cxx11::string::~string(this);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_188);
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}